

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

ktx_error_code_e __thiscall
anon_unknown.dwarf_bfba::TextureWriterTestHelper<unsigned_short,_2U,_33324U>::copyImagesToTexture
          (TextureWriterTestHelper<unsigned_short,_2U,_33324U> *this,ktxTexture1 *texture)

{
  pointer puVar1;
  ktx_error_code_e kVar2;
  ulong uVar3;
  pointer pvVar4;
  pointer pvVar5;
  ulong uVar6;
  pointer pvVar7;
  ulong uVar8;
  pointer pvVar9;
  ulong uVar10;
  
  pvVar4 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar9 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 == pvVar4) {
    kVar2 = KTX_SUCCESS;
  }
  else {
    uVar10 = 0;
    kVar2 = KTX_SUCCESS;
    do {
      pvVar5 = pvVar4[uVar10].
               super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar4[uVar10].
          super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
        uVar6 = 0;
        do {
          pvVar7 = pvVar5[uVar6].
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pvVar5[uVar6].
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pvVar7) {
            uVar8 = 0;
            do {
              puVar1 = pvVar7[uVar8].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              kVar2 = ktxTexture1_SetImageFromMemory
                                (texture,uVar10,uVar6,uVar8,puVar1,
                                 (long)pvVar7[uVar8].
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
              pvVar4 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                       super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (kVar2 != KTX_SUCCESS) {
                pvVar5 = pvVar4[uVar10].
                         super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_0013069e;
              }
              uVar8 = (ulong)((int)uVar8 + 1);
              pvVar5 = pvVar4[uVar10].
                       super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar7 = pvVar5[uVar6].
                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar3 = ((long)pvVar5[uVar6].
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
                      -0x5555555555555555;
            } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
            kVar2 = KTX_SUCCESS;
          }
LAB_0013069e:
          uVar6 = (ulong)((int)uVar6 + 1);
          uVar8 = ((long)pvVar4[uVar10].
                         super__Vector_base<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                  -0x5555555555555555;
        } while (uVar6 <= uVar8 && uVar8 - uVar6 != 0);
        pvVar9 = (this->super_WriterTestHelper<unsigned_short,_2U,_33324U>).images.
                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar6 = ((long)pvVar9 - (long)pvVar4 >> 3) * -0x5555555555555555;
    } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
  }
  return kVar2;
}

Assistant:

KTX_error_code
    copyImagesToTexture(ktxTexture1* texture) {
        KTX_error_code result = KTX_SUCCESS;

        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            for (ktx_uint32_t layer = 0; layer < images[level].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    ktx_size_t imageBytes = images[level][layer][faceSlice].size() * sizeof(component_type);
                    ktx_uint8_t* imageDataPtr = (ktx_uint8_t*)(images[level][layer][faceSlice].data());
                    result = ktxTexture1_SetImageFromMemory(texture,
                                                            level, layer,
                                                            faceSlice,
                                                            imageDataPtr,
                                                            imageBytes);
                   if (result != KTX_SUCCESS)
                       break;
                }
            }
        }
        return result;
    }